

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

int __thiscall Imf_2_5::OutputFile::currentScanLine(OutputFile *this)

{
  long in_RDI;
  Lock lock;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  Mutex *in_stack_ffffffffffffffe8;
  Lock *in_stack_fffffffffffffff0;
  
  IlmThread_2_5::Lock::Lock
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
             SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0x78);
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  return iVar1;
}

Assistant:

int	
OutputFile::currentScanLine () const
{
    Lock lock (*_data->_streamData);
    return _data->currentScanLine;
}